

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_perform_login(connectdata *conn)

{
  imapstate iVar1;
  CURLcode CVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  
  iVar1 = IMAP_STOP;
  if ((conn->bits).user_passwd == true) {
    pcVar3 = imap_atom(conn->user,false);
    pcVar4 = imap_atom(conn->passwd,false);
    pcVar6 = pcVar3;
    if (pcVar3 == (char *)0x0) {
      pcVar6 = "";
    }
    pcVar5 = "";
    if (pcVar4 != (char *)0x0) {
      pcVar5 = pcVar4;
    }
    CVar2 = imap_sendf(conn,"LOGIN %s %s",pcVar6,pcVar5);
    (*Curl_cfree)(pcVar3);
    (*Curl_cfree)(pcVar4);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    iVar1 = IMAP_LOGIN;
  }
  (conn->proto).imapc.state = iVar1;
  return CURLE_OK;
}

Assistant:

static CURLcode imap_perform_login(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  char *user;
  char *passwd;

  /* Check we have a username and password to authenticate with and end the
     connect phase if we don't */
  if(!conn->bits.user_passwd) {
    state(conn, IMAP_STOP);

    return result;
  }

  /* Make sure the username and password are in the correct atom format */
  user = imap_atom(conn->user, false);
  passwd = imap_atom(conn->passwd, false);

  /* Send the LOGIN command */
  result = imap_sendf(conn, "LOGIN %s %s", user ? user : "",
                      passwd ? passwd : "");

  free(user);
  free(passwd);

  if(!result)
    state(conn, IMAP_LOGIN);

  return result;
}